

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectModel.cpp
# Opt level: O2

bool __thiscall Lodtalk::VMContext::isClassOrMetaclass(VMContext *this,Oop oop)

{
  int iVar1;
  Oop obj;
  bool bVar2;
  
  iVar1 = classIndexOf(oop);
  bVar2 = true;
  if (iVar1 != 0xc) {
    iVar1 = classIndexOf(oop);
    obj = getClassFromIndex(this,iVar1);
    iVar1 = classIndexOf(obj);
    bVar2 = iVar1 == 0xc;
  }
  return bVar2;
}

Assistant:

bool VMContext::isClassOrMetaclass(Oop oop)
{
	auto classIndex = classIndexOf(oop);
	if(classIndex == SCI_Metaclass)
		return true;

	auto clazz = getClassFromIndex(classIndexOf(oop));
	return classIndexOf(clazz) == SCI_Metaclass;
}